

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ClipControlApi::ClipControlApi(ClipControlApi *this,Context *context,API api)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  string local_40;
  
  this->m_context = context;
  if (api != API_GL_45core) {
    if (api == API_GL_ARB_clip_control) {
      bVar1 = glu::ContextInfo::isExtensionSupported(context->m_contextInfo,"GL_ARB_clip_control");
      if (bVar1) goto LAB_00a3edd5;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Required clip_control extension is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_00a3edd5:
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  this->clipControl = *(glClipControlFunc *)(CONCAT44(extraout_var,iVar2) + 0x230);
  return;
}

Assistant:

ClipControlApi(deqp::Context& context, ClipControlTests::API api) : m_context(context)
	{
		if (!Supported(m_context, api))
		{
			throw tcu::NotSupportedError("Required clip_control extension is not supported");
		}

		switch (api)
		{
		case ClipControlTests::API_GL_ARB_clip_control:
		case ClipControlTests::API_GL_45core: //fall through
			clipControl = context.getRenderContext().getFunctions().clipControl;
			break;
		}
	}